

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_explain_analyze.cpp
# Opt level: O1

SinkFinalizeType __thiscall
duckdb::PhysicalExplainAnalyze::Finalize
          (PhysicalExplainAnalyze *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  GlobalSinkState *pGVar1;
  QueryProfiler *this_00;
  string local_30;
  
  pGVar1 = input->global_state;
  this_00 = QueryProfiler::Get(context);
  QueryProfiler::ToString_abi_cxx11_(&local_30,this_00,this->format);
  ::std::__cxx11::string::operator=((string *)(pGVar1 + 1),(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalExplainAnalyze::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                  OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<ExplainAnalyzeStateGlobalState>();
	auto &profiler = QueryProfiler::Get(context);
	gstate.analyzed_plan = profiler.ToString(format);
	return SinkFinalizeType::READY;
}